

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPSegment.hpp
# Opt level: O0

bool __thiscall cppjieba::MPSegment::IsUserDictSingleChineseWord(MPSegment *this,Rune *value)

{
  bool bVar1;
  DictTrie *in_RSI;
  Rune *in_stack_ffffffffffffffe8;
  
  bVar1 = DictTrie::IsUserDictSingleChineseWord(in_RSI,in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

bool IsUserDictSingleChineseWord(const Rune& value) const {
    return dictTrie_->IsUserDictSingleChineseWord(value);
  }